

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::TPZDohrSubstruct
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  long lVar1;
  TPZReference *pTVar2;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_80;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_78;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_70;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_68;
  TPZStepSolver<std::complex<long_double>_> *local_60;
  TPZStepSolver<std::complex<long_double>_> *local_58;
  TPZStepSolver<std::complex<long_double>_> *local_50;
  TPZManVector<std::complex<long_double>,_10> *local_48;
  TPZFMatrix<std::complex<long_double>_> *local_40;
  TPZStepSolver<std::complex<long_double>_> *local_38;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstruct_019eb310;
  (this->fC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0'
  ;
  (this->fC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fC_star).fElem = (complex<long_double> *)0x0;
  (this->fC_star).fGiven = (complex<long_double> *)0x0;
  (this->fC_star).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fC_star).fPivot.super_TPZVec<int>,0);
  (this->fC_star).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fC_star).fPivot.super_TPZVec<int>.fStore = (this->fC_star).fPivot.fExtAlloc;
  (this->fC_star).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fC_star).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fC_star).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fC_star).fWork.fStore = (complex<long_double> *)0x0;
  (this->fC_star).fWork.fNElements = 0;
  (this->fC_star).fWork.fNAlloc = 0;
  (this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fKeC_star).fElem = (complex<long_double> *)0x0;
  (this->fKeC_star).fGiven = (complex<long_double> *)0x0;
  (this->fKeC_star).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fKeC_star).fPivot.super_TPZVec<int>,0);
  (this->fKeC_star).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fKeC_star).fPivot.super_TPZVec<int>.fStore = (this->fKeC_star).fPivot.fExtAlloc;
  (this->fKeC_star).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fKeC_star).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fKeC_star).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fKeC_star).fWork.fStore = (complex<long_double> *)0x0;
  (this->fKeC_star).fWork.fNElements = 0;
  (this->fKeC_star).fWork.fNAlloc = 0;
  local_68.fRef = (TPZReference *)operator_new(0x10);
  ((local_68.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_68.fRef)->fPointer = (TPZMatrix<std::complex<long_double>_> *)0x0;
  LOCK();
  ((local_68.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(&this->finv,&local_68);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_68);
  (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fNullPivots).fElem = (complex<long_double> *)0x0;
  (this->fNullPivots).fGiven = (complex<long_double> *)0x0;
  (this->fNullPivots).fSize = 0;
  local_38 = &this->finv;
  TPZVec<int>::TPZVec(&(this->fNullPivots).fPivot.super_TPZVec<int>,0);
  (this->fNullPivots).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fNullPivots).fPivot.super_TPZVec<int>.fStore = (this->fNullPivots).fPivot.fExtAlloc;
  (this->fNullPivots).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fNullPivots).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fNullPivots).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fNullPivots).fWork.fStore = (complex<long_double> *)0x0;
  (this->fNullPivots).fWork.fNElements = 0;
  (this->fNullPivots).fWork.fNAlloc = 0;
  (this->fCoarseNodes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fCoarseNodes).fStore = (int *)0x0;
  (this->fCoarseNodes).fNElements = 0;
  (this->fCoarseNodes).fNAlloc = 0;
  (this->fC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fC).fElem = (complex<long_double> *)0x0;
  (this->fC).fGiven = (complex<long_double> *)0x0;
  (this->fC).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fC).fPivot.super_TPZVec<int>,0);
  (this->fC).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fC).fPivot.super_TPZVec<int>.fStore = (this->fC).fPivot.fExtAlloc;
  (this->fC).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fC).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fC).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fC).fWork.fStore = (complex<long_double> *)0x0;
  (this->fC).fWork.fNElements = 0;
  (this->fC).fWork.fNAlloc = 0;
  (this->fPhiC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fPhiC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fPhiC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fPhiC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fPhiC).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fPhiC).fElem = (complex<long_double> *)0x0;
  (this->fPhiC).fGiven = (complex<long_double> *)0x0;
  (this->fPhiC).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPhiC).fPivot.super_TPZVec<int>,0);
  (this->fPhiC).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPhiC).fPivot.super_TPZVec<int>.fStore = (this->fPhiC).fPivot.fExtAlloc;
  (this->fPhiC).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhiC).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhiC).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fPhiC).fWork.fStore = (complex<long_double> *)0x0;
  (this->fPhiC).fWork.fNElements = 0;
  (this->fPhiC).fWork.fNAlloc = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fRow = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fCol = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fPhiC_Weighted_Condensed).fElem = (complex<long_double> *)0x0;
  (this->fPhiC_Weighted_Condensed).fGiven = (complex<long_double> *)0x0;
  (this->fPhiC_Weighted_Condensed).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>,0);
  local_40 = &this->fPhiC_Weighted_Condensed;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fStore =
       (this->fPhiC_Weighted_Condensed).fPivot.fExtAlloc;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhiC_Weighted_Condensed).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fPhiC_Weighted_Condensed).fWork.fStore = (complex<long_double> *)0x0;
  (this->fPhiC_Weighted_Condensed).fWork.fNElements = 0;
  lVar1 = 0;
  (this->fPhiC_Weighted_Condensed).fWork.fNAlloc = 0;
  (this->fCoarseIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fCoarseIndex).fStore = (int *)0x0;
  (this->fCoarseIndex).fNElements = 0;
  (this->fCoarseIndex).fNAlloc = 0;
  local_48 = &this->fWeights;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore = (complex<long_double> *)0x0;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fNElements = 0;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fNAlloc = 0;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0182ed00;
  do {
    *(longdouble *)((this->fWeights).fExtAlloc[0]._M_value + lVar1) = (longdouble)0;
    *(longdouble *)((this->fWeights).fExtAlloc[0]._M_value + lVar1 + 0x10) = (longdouble)0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x140);
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore = (this->fWeights).fExtAlloc;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fNElements = 0;
  (this->fWeights).super_TPZVec<std::complex<long_double>_>.fNAlloc = 0;
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = (TPZMatrix<std::complex<long_double>_> *)0x0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fStiffness).fRef = pTVar2;
  (this->fKCi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fKCi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fKCi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fKCi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fKCi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fKCi).fElem = (complex<long_double> *)0x0;
  (this->fKCi).fGiven = (complex<long_double> *)0x0;
  (this->fKCi).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fKCi).fPivot.super_TPZVec<int>,0);
  (this->fKCi).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fKCi).fPivot.super_TPZVec<int>.fStore = (this->fKCi).fPivot.fExtAlloc;
  (this->fKCi).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fKCi).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fKCi).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fKCi).fWork.fStore = (complex<long_double> *)0x0;
  (this->fKCi).fWork.fNElements = 0;
  (this->fKCi).fWork.fNAlloc = 0;
  (this->fGlobalIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fGlobalIndex).fStore = (int *)0x0;
  (this->fGlobalIndex).fNElements = 0;
  (this->fGlobalIndex).fNAlloc = 0;
  (this->fGlobalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018bdb50;
  (this->fGlobalEqs).fStore = (pair<int,_int> *)0x0;
  (this->fGlobalEqs).fNElements = 0;
  (this->fGlobalEqs).fNAlloc = 0;
  local_70.fRef = (TPZReference *)operator_new(0x10);
  ((local_70.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_70.fRef)->fPointer = (TPZMatrix<std::complex<long_double>_> *)0x0;
  LOCK();
  ((local_70.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_50 = &this->fInvertedStiffness;
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(local_50,&local_70);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_70);
  local_78.fRef = (TPZReference *)operator_new(0x10);
  ((local_78.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_78.fRef)->fPointer = (TPZMatrix<std::complex<long_double>_> *)0x0;
  LOCK();
  ((local_78.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_58 = &this->fInvertedInternalStiffness;
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(local_58,&local_78);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_78);
  local_80.fRef = (TPZReference *)operator_new(0x10);
  ((local_80.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_80.fRef)->fPointer = (TPZMatrix<std::complex<long_double>_> *)0x0;
  LOCK();
  ((local_80.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_60 = &this->fKCInvert;
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(local_60,&local_80);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_80);
  (this->fInternalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fInternalEqs).fStore = (int *)0x0;
  (this->fInternalEqs).fNElements = 0;
  (this->fInternalEqs).fNAlloc = 0;
  (this->fBoundaryEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fBoundaryEqs).fStore = (int *)0x0;
  (this->fBoundaryEqs).fNElements = 0;
  (this->fBoundaryEqs).fNAlloc = 0;
  (this->fLocalLoad).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fLocalLoad).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fLocalLoad).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fLocalLoad).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fLocalLoad).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fLocalLoad).fElem = (complex<long_double> *)0x0;
  (this->fLocalLoad).fGiven = (complex<long_double> *)0x0;
  (this->fLocalLoad).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fLocalLoad).fPivot.super_TPZVec<int>,0);
  (this->fLocalLoad).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fStore = (this->fLocalLoad).fPivot.fExtAlloc;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fLocalLoad).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fLocalLoad).fWork.fStore = (complex<long_double> *)0x0;
  (this->fLocalLoad).fWork.fNElements = 0;
  (this->fLocalLoad).fWork.fNAlloc = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fRow = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fCol = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  (this->fLocalWeightedResidual).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fLocalWeightedResidual).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fLocalWeightedResidual).fElem = (complex<long_double> *)0x0;
  (this->fLocalWeightedResidual).fGiven = (complex<long_double> *)0x0;
  (this->fLocalWeightedResidual).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fLocalWeightedResidual).fPivot.super_TPZVec<int>,0);
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fStore =
       (this->fLocalWeightedResidual).fPivot.fExtAlloc;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fLocalWeightedResidual).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fLocalWeightedResidual).fWork.fStore = (complex<long_double> *)0x0;
  (this->fLocalWeightedResidual).fWork.fNElements = 0;
  (this->fLocalWeightedResidual).fWork.fNAlloc = 0;
  (this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fzi).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fzi).fElem = (complex<long_double> *)0x0;
  (this->fzi).fGiven = (complex<long_double> *)0x0;
  (this->fzi).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fzi).fPivot.super_TPZVec<int>,0);
  (this->fzi).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fzi).fPivot.super_TPZVec<int>.fStore = (this->fzi).fPivot.fExtAlloc;
  (this->fzi).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fzi).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fzi).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fzi).fWork.fStore = (complex<long_double> *)0x0;
  (this->fzi).fWork.fNElements = 0;
  (this->fzi).fWork.fNAlloc = 0;
  (this->fAdjustSolution).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fAdjustSolution).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fAdjustSolution).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  (this->fAdjustSolution).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fAdjustSolution).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  (this->fAdjustSolution).fElem = (complex<long_double> *)0x0;
  (this->fAdjustSolution).fGiven = (complex<long_double> *)0x0;
  (this->fAdjustSolution).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fAdjustSolution).fPivot.super_TPZVec<int>,0);
  (this->fAdjustSolution).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fStore = (this->fAdjustSolution).fPivot.fExtAlloc
  ;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fAdjustSolution).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fAdjustSolution).fWork.fStore = (complex<long_double> *)0x0;
  (this->fAdjustSolution).fWork.fNElements = 0;
  (this->fAdjustSolution).fWork.fNAlloc = 0;
  return;
}

Assistant:

TPZDohrSubstruct<TVar>::TPZDohrSubstruct()
{
	//Inicializacao
}